

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WhereClauseInit(WhereClause *pWC,WhereInfo *pWInfo)

{
  WhereInfo *pWInfo_local;
  WhereClause *pWC_local;
  
  pWC->pWInfo = pWInfo;
  pWC->hasOr = '\0';
  pWC->pOuter = (WhereClause *)0x0;
  pWC->nTerm = 0;
  pWC->nSlot = 8;
  pWC->a = pWC->aStatic;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereClauseInit(
  WhereClause *pWC,        /* The WhereClause to be initialized */
  WhereInfo *pWInfo        /* The WHERE processing context */
){
  pWC->pWInfo = pWInfo;
  pWC->hasOr = 0;
  pWC->pOuter = 0;
  pWC->nTerm = 0;
  pWC->nSlot = ArraySize(pWC->aStatic);
  pWC->a = pWC->aStatic;
}